

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O2

double bsc_costs_std_2tree_put(bsc_group_t group,bsc_coll_params_t *set,bsc_size_t n)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  if (group == (bsc_group_t)0x0) {
    iVar1 = bsp_nprocs();
  }
  else {
    iVar1 = *group;
  }
  uVar3 = 0;
  dVar4 = bsc_L(BSC_PUT);
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 * 0x30 - uVar3 != 0; uVar3 = uVar3 + 0x30) {
    dVar5 = bsc_g(BSC_PUT,*(int *)((long)&set->size + uVar3));
    dVar4 = dVar4 + (double)*(int *)((long)&set->size + uVar3) * dVar5;
  }
  dVar5 = 0.0;
  if (iVar1 != 1) {
    iVar1 = uint32_log2(iVar1 - 1);
    dVar5 = dVar4 * (double)(iVar1 + 1);
  }
  return dVar5;
}

Assistant:

double bsc_costs_std_2tree_put(  bsc_group_t group,
         bsc_coll_params_t * set, bsc_size_t n )
{
    bsc_size_t i;
    group_t * g = group;
    bsc_pid_t P = g?g->size:bsp_nprocs() ;
    double one_phase = bsc_L(BSC_PUT);
    for ( i = 0; i < n ; ++i )
        one_phase += bsc_g(BSC_PUT, set[i].size) * set[i].size;

    return P==1?0:(int_log2(P-1)+1) * one_phase ;
}